

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O0

PyObject * __thiscall
boost::python::detail::caller_arity<1U>::
impl<boost::python::detail::member<std::vector<int,_std::allocator<int>_>,_HFParsingInfo>,_boost::python::return_internal_reference<1UL,_boost::python::default_call_policies>,_boost::mpl::vector2<std::vector<int,_std::allocator<int>_>_&,_HFParsingInfo_&>_>
::operator()(impl<boost::python::detail::member<std::vector<int,_std::allocator<int>_>,_HFParsingInfo>,_boost::python::return_internal_reference<1UL,_boost::python::default_call_policies>,_boost::mpl::vector2<std::vector<int,_std::allocator<int>_>_&,_HFParsingInfo_&>_>
             *this,PyObject *args_,PyObject *param_3)

{
  bool bVar1;
  first_reference pmVar2;
  _object *in_RSI;
  arg_from_python<HFParsingInfo_&> *in_RDI;
  PyObject *result;
  c_t0 c0;
  argument_package inner_args;
  PyObject *in_stack_ffffffffffffffa8;
  undefined1 local_43 [3];
  PyObject *local_40;
  arg_lvalue_from_python_base in_stack_ffffffffffffffd0;
  _object *local_18 [2];
  PyObject *local_8;
  
  get<0>(&stack0xffffffffffffffd8);
  arg_from_python<HFParsingInfo_&>::arg_from_python(in_RDI,in_stack_ffffffffffffffa8);
  bVar1 = converter::arg_lvalue_from_python_base::convertible
                    ((arg_lvalue_from_python_base *)&stack0xffffffffffffffd0);
  if (bVar1) {
    compressed_pair<boost::python::detail::member<std::vector<int,_std::allocator<int>_>,_HFParsingInfo>,_boost::python::return_internal_reference<1UL,_boost::python::default_call_policies>_>
    ::second((compressed_pair<boost::python::detail::member<std::vector<int,_std::allocator<int>_>,_HFParsingInfo>,_boost::python::return_internal_reference<1UL,_boost::python::default_call_policies>_>
              *)0x3c08a1);
    bVar1 = default_call_policies::precall<_object*>((_object **)&stack0xffffffffffffffd8);
    if (bVar1) {
      create_result_converter<_object*,boost::python::to_python_indirect<std::vector<int,std::allocator<int>>&,boost::python::detail::make_reference_holder>>
                (local_18,(to_python_indirect<std::vector<int,_std::allocator<int>_>_&,_boost::python::detail::make_reference_holder>
                           *)0x0);
      pmVar2 = compressed_pair<boost::python::detail::member<std::vector<int,_std::allocator<int>_>,_HFParsingInfo>,_boost::python::return_internal_reference<1UL,_boost::python::default_call_policies>_>
               ::first((compressed_pair<boost::python::detail::member<std::vector<int,_std::allocator<int>_>,_HFParsingInfo>,_boost::python::return_internal_reference<1UL,_boost::python::default_call_policies>_>
                        *)0x3c08d7);
      local_40 = invoke<boost::python::to_python_indirect<std::vector<int,std::allocator<int>>&,boost::python::detail::make_reference_holder>,boost::python::detail::member<std::vector<int,std::allocator<int>>,HFParsingInfo>,boost::python::arg_from_python<HFParsingInfo&>>
                           (local_43,pmVar2,&stack0xffffffffffffffd0);
      compressed_pair<boost::python::detail::member<std::vector<int,_std::allocator<int>_>,_HFParsingInfo>,_boost::python::return_internal_reference<1UL,_boost::python::default_call_policies>_>
      ::second((compressed_pair<boost::python::detail::member<std::vector<int,_std::allocator<int>_>,_HFParsingInfo>,_boost::python::return_internal_reference<1UL,_boost::python::default_call_policies>_>
                *)0x3c08f8);
      local_8 = with_custodian_and_ward_postcall<0ul,1ul,boost::python::default_call_policies>::
                postcall<_object*>((_object **)in_RSI,(PyObject *)in_stack_ffffffffffffffd0.m_result
                                  );
    }
    else {
      local_8 = (PyObject *)0x0;
    }
  }
  else {
    local_8 = (PyObject *)0x0;
  }
  return local_8;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }